

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp3cue-main.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  char *__src;
  mp3cue_track_t *__ptr;
  FILE *__stream;
  adu_t *adu;
  mp3_frame_t *frame_00;
  ulong uVar3;
  ulong time;
  file_t *file;
  char *pcVar4;
  uint uVar5;
  file_t outfile;
  file_t mp3file;
  mp3cue_file_t cuefile;
  aq_t qout;
  aq_t qin;
  char outfilename [193];
  char to_buf [256];
  char from_buf [256];
  mp3_frame_t frame;
  
  __src = (char *)0x0;
  while (iVar1 = getopt(argc,argv,"c:C:"), -1 < iVar1) {
    if (iVar1 != 0x43) {
      if (iVar1 != 99) goto LAB_0010414b;
      free(__src);
      __src = strdup(_optarg);
    }
  }
  if (_optind == argc) {
LAB_0010414b:
    usage();
    iVar1 = 0;
  }
  else {
    pcVar4 = argv[_optind];
    if (pcVar4 == (char *)0x0 || __src == (char *)0x0) {
      usage();
    }
    else {
      __ptr = (mp3cue_track_t *)malloc(0xbe0);
      if (__ptr != (mp3cue_track_t *)0x0) {
        yymp3_cue_file = &cuefile;
        cuefile.track_number = 0;
        cuefile.max_track_number = 0x14;
        cuefile.tracks = __ptr;
        strncpy(cuefile.title,__src,0x40);
        __stream = fopen(__src,"r");
        if (__stream == (FILE *)0x0) {
          fprintf(_stderr,"Could not open cuefile %s\n",__src);
          iVar1 = 1;
        }
        else {
          iVar1 = 1;
          yyin = (FILE *)__stream;
          iVar2 = yyparse();
          if (iVar2 == 0) {
            iVar1 = file_open_read(&mp3file,pcVar4);
            if (iVar1 == 0) {
              fprintf(_stderr,"Could not open mp3 file: %s\n",pcVar4);
              return 0;
            }
            aq_init(&qin);
            uVar3 = 0;
            time = 0;
            while( true ) {
              if ((cuefile._132_8_ & 0xffffffff) <= uVar3) break;
              if ((cuefile.tracks[uVar3].performer[0] == '\0') ||
                 (cuefile.tracks[uVar3].title[0] == '\0')) {
                snprintf(outfilename,0xc0,"%02d. %s.mp3",(ulong)(uint)cuefile.tracks[uVar3].number,
                         cuefile.title);
              }
              else {
                snprintf(outfilename,0xc0,"%02d. %s - %s.mp3",
                         (ulong)(uint)cuefile.tracks[uVar3].number,cuefile.tracks[uVar3].performer,
                         cuefile.tracks[uVar3].title);
              }
              aq_init(&qout);
              iVar1 = file_open_write(&outfile,outfilename);
              if (iVar1 == 0) {
                fprintf(_stderr,"Could not open mp3 file: %s\n",outfilename);
                file_close(&mp3file);
LAB_00104592:
                iVar1 = 1;
                goto LAB_001045a0;
              }
              uVar5 = ((cuefile.tracks[uVar3].index.minutes * 0x3c +
                       cuefile.tracks[uVar3].index.seconds) * 100 +
                      cuefile.tracks[uVar3].index.centiseconds) * 10;
              format_time(time,from_buf,0x100);
              format_time((ulong)uVar5,to_buf,0x100);
              pcVar4 = to_buf;
              if (uVar5 == 0) {
                pcVar4 = "end";
              }
              printf("Extracting track %d (%s): %s - %s...\n",uVar3,outfilename,from_buf,pcVar4);
              iVar1 = mp3cue_write_id3(&outfile,&cuefile,cuefile.tracks + uVar3);
              if (iVar1 == 0) {
                fprintf(_stderr,"Could not write id3 tags to file: %s\n",outfilename);
                file_close(&outfile);
                file = &mp3file;
LAB_00104588:
                file_close(file);
                goto LAB_00104592;
              }
              while( true ) {
                if ((uVar5 <= time) && (uVar3 != cuefile.track_number - 1)) goto LAB_001044ec;
                iVar1 = mp3_next_frame(&mp3file,&frame);
                if (iVar1 < 1) break;
                iVar1 = aq_add_frame(&qin,&frame);
                if (iVar1 != 0) {
                  adu = aq_get_adu(&qin);
                  if (adu == (adu_t *)0x0) {
                    __assert_fail("adu != NULL",
                                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3cue-main.c"
                                  ,0xc5,"int main(int, char **)");
                  }
                  iVar1 = aq_add_adu(&qout,adu);
                  if (iVar1 != 0) {
                    frame_00 = aq_get_frame(&qout);
                    if (frame_00 == (mp3_frame_t *)0x0) {
                      __assert_fail("frame_out != NULL",
                                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/mp3cue-main.c"
                                    ,0xc9,"int main(int, char **)");
                    }
                    memset(frame_00->raw,0,frame_00->si_size + 4);
                    iVar1 = mp3_fill_hdr(frame_00);
                    if (((iVar1 == 0) || (iVar1 = mp3_fill_si(frame_00), iVar1 == 0)) ||
                       (iVar1 = mp3_write_frame(&outfile,frame_00), iVar1 < 1)) {
                      fwrite("Could not write frame\n",0x16,1,_stderr);
                      file_close(&mp3file);
                      file = &outfile;
                      goto LAB_00104588;
                    }
                    free(frame_00);
                  }
                  free(adu);
                }
                time = time + frame.usec / 1000;
              }
              if (uVar3 != cuefile.track_number - 1) {
                fwrite("Could not read the next frame from the mp3 file...\n",0x33,1,_stderr);
              }
LAB_001044ec:
              file_close(&outfile);
              aq_destroy(&qout);
              fprintf(_stderr,"%s written\n",outfilename);
              uVar3 = uVar3 + 1;
            }
            file_close(&mp3file);
            aq_destroy(&qin);
            iVar1 = 0;
          }
LAB_001045a0:
          fclose(__stream);
        }
        goto LAB_00104156;
      }
      fwrite("Could not allocate memory for tracks\n",0x25,1,_stderr);
    }
    iVar1 = 1;
  }
  __ptr = (mp3cue_track_t *)0x0;
LAB_00104156:
  free(__ptr);
  free(__src);
  return iVar1;
}

Assistant:

int main(int argc, char *argv[]) {
    char *cuefilename = NULL,
        *mp3filename = NULL;
    int retval = EXIT_SUCCESS;
    FILE *cuein = NULL;
    mp3cue_track_t *cuetracks = NULL;

    int c;
    while ((c = getopt(argc, argv, "c:C:")) >= 0) {
        switch (c) {
        case 'c':
            if (cuefilename != NULL) {
                free(cuefilename);
            }
            cuefilename = strdup(optarg);
            break;

        case 'C':
            break;

        default:
            usage();
            goto exit;
        }
    }

    if (optind == argc) {
        usage();
        goto exit;
    }
    mp3filename = argv[optind];

    if ((cuefilename == NULL) || (mp3filename == NULL)) {
        usage();
        retval = EXIT_FAILURE;
        goto exit;
    }

    /*M
      Initialize the mp3 cue structure.
    **/
    mp3cue_file_t cuefile;
    cuetracks = malloc(sizeof(mp3cue_track_t) * MP3CUE_DEFAULT_TRACK_NUMBER);
    if (cuetracks == NULL) {
        fprintf(stderr, "Could not allocate memory for tracks\n");
        retval = EXIT_FAILURE;
        goto exit;
    }
    cuefile.tracks = cuetracks;
    cuefile.track_number = 0;
    cuefile.max_track_number = MP3CUE_DEFAULT_TRACK_NUMBER;
    yymp3_cue_file = &cuefile;
    strncpy(cuefile.title, cuefilename, MP3CUE_MAX_STRING_LENGTH);

    /*M
      Open the input file.
    **/
    cuein = fopen(cuefilename, "r");
    if (cuein == NULL) {
        fprintf(stderr, "Could not open cuefile %s\n", cuefilename);
        retval = EXIT_FAILURE;
        goto exit;
    }

    /*M
      Parse the input file.
    **/
    extern FILE *yyin;
    yyin = cuein;

    if (yyparse() != 0) {
        retval = EXIT_FAILURE;
        goto exit;
    }

    /*M
      Open the MP3 file.
    **/
    file_t mp3file;
    if (!file_open_read(&mp3file, mp3filename)) {
        fprintf(stderr, "Could not open mp3 file: %s\n", mp3filename);
        retval = EXIT_FAILURE;
        return 0;
    }

    aq_t qin;
    aq_init(&qin);

    unsigned long current = 0;

    /*M
      For each track, cut out the relevant part and save it.
    **/
    unsigned int i;
    for (i = 0; i < cuefile.track_number; i++) {
        char outfilename[MP3CUE_MAX_STRING_LENGTH * 3 + 1];
        if (strlen(cuefile.tracks[i].performer) > 0 &&
            strlen(cuefile.tracks[i].title) > 0) {
            snprintf(outfilename, MP3CUE_MAX_STRING_LENGTH * 3,
                     "%02d. %s - %s.mp3", cuefile.tracks[i].number,
                     cuefile.tracks[i].performer, cuefile.tracks[i].title);
        } else {
            snprintf(outfilename, MP3CUE_MAX_STRING_LENGTH * 3,
                     "%02d. %s.mp3", cuefile.tracks[i].number,
                     cuefile.title);
        }

        aq_t qout;
        aq_init(&qout);

        /*M
          Open the output MP3 file.
        **/
        file_t outfile;
        if (!file_open_write(&outfile, outfilename)) {
            fprintf(stderr, "Could not open mp3 file: %s\n", outfilename);
            file_close(&mp3file);
            retval = EXIT_FAILURE;
            goto exit;
        }

        /* end time in msecs */
        unsigned long end = (((cuefile.tracks[i].index.minutes * 60) +
                              cuefile.tracks[i].index.seconds) * 100 +
                             cuefile.tracks[i].index.centiseconds) * 10;
        char from_buf[256], to_buf[256];
        format_time(current, from_buf, sizeof(from_buf));
        format_time(end, to_buf, sizeof(to_buf));
        printf("Extracting track %d (%s): %s - %s...\n", i, outfilename,
               from_buf, end ? to_buf : "end");

        /* write id3 tags */
        if (!mp3cue_write_id3(&outfile, &cuefile, &cuefile.tracks[i])) {
            fprintf(stderr, "Could not write id3 tags to file: %s\n", outfilename);
            file_close(&outfile);
            file_close(&mp3file);
            retval = EXIT_FAILURE;
            goto exit;
        }

        /*M
          Read in the input file

          Read while current < end or till the end of the file if it's the last track.
        **/
        while ((current < end) || (i == (cuefile.track_number - 1))) {
            mp3_frame_t frame;
            if (mp3_next_frame(&mp3file, &frame) > 0) {
                if (aq_add_frame(&qin, &frame)) {
                    adu_t *adu = aq_get_adu(&qin);
                    assert(adu != NULL);

                    if (aq_add_adu(&qout, adu)) {
                        mp3_frame_t *frame_out = aq_get_frame(&qout);
                        assert(frame_out != NULL);

                        memset(frame_out->raw, 0, 4 + frame_out->si_size);
                        if (!mp3_fill_hdr(frame_out) ||
                            !mp3_fill_si(frame_out) ||
                            (mp3_write_frame(&outfile, frame_out) <= 0)) {
                            fprintf(stderr, "Could not write frame\n");
                            file_close(&mp3file);
                            file_close(&outfile);
                            retval = 1;
                            goto exit;
                        }

                        free(frame_out);
                    }

                    free(adu);
                }

                current += frame.usec / 1000;
            } else {
                if (i != (cuefile.track_number - 1)) {
                    fprintf(stderr, "Could not read the next frame from the mp3 file...\n");
                }
                break;
            }
        }

        /*M
          Close the output file.
        **/
        file_close(&outfile);
        aq_destroy(&qout);

        fprintf(stderr, "%s written\n", outfilename);
    }

    /*M
      Close the input file.
    **/
    file_close(&mp3file);
    aq_destroy(&qin);


    /*M
      Cleanup the data structures.
    **/
    exit:
    if (cuein != NULL) {
        fclose(cuein);
    }
    if (cuetracks != NULL) {
        free(cuetracks);
    }

    if (cuefilename != NULL) {
        free(cuefilename);
    }

    return retval;
}